

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O3

Aig_Obj_t ** Aig_TableFind(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  ulong uVar4;
  ulong uVar5;
  Aig_Obj_t *pAVar6;
  ulong uVar7;
  ulong uVar8;
  
  pAVar6 = pObj->pFanin0;
  if ((pAVar6 != (Aig_Obj_t *)0x0) && (pAVar3 = pObj->pFanin1, pAVar3 != (Aig_Obj_t *)0x0)) {
    iVar1 = *(int *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x24);
    iVar2 = *(int *)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x24);
    if (iVar2 <= iVar1) {
      __assert_fail("Aig_ObjFanin0(pObj)->Id < Aig_ObjFanin1(pObj)->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                    ,0x2e,"Aig_Obj_t **Aig_TableFind(Aig_Man_t *, Aig_Obj_t *)");
    }
    uVar8 = 0;
    uVar7 = 0x6a3;
    if ((*(uint *)&pObj->field_0x18 & 7) != 6) {
      uVar7 = uVar8;
    }
    uVar4 = 0x38f;
    if (((ulong)pAVar6 & 1) == 0) {
      uVar4 = uVar8;
    }
    uVar5 = 0x161;
    if (((ulong)pAVar3 & 1) == 0) {
      uVar5 = uVar8;
    }
    pAVar6 = (Aig_Obj_t *)
             (p->pTable +
             ((long)iVar2 * 0xb9b ^ uVar7 ^ uVar5 ^ uVar4 ^ (long)iVar1 * 0x1f01) %
             (ulong)(long)p->nTableSize);
    do {
      pAVar3 = pAVar6;
      pAVar6 = (pAVar6->field_0).pNext;
      if (pAVar6 == (Aig_Obj_t *)0x0) {
        return (Aig_Obj_t **)pAVar3;
      }
    } while (pAVar6 != pObj);
    return (Aig_Obj_t **)pAVar3;
  }
  __assert_fail("Aig_ObjChild0(pObj) && Aig_ObjChild1(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                ,0x2d,"Aig_Obj_t **Aig_TableFind(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

static Aig_Obj_t ** Aig_TableFind( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t ** ppEntry;
    assert( Aig_ObjChild0(pObj) && Aig_ObjChild1(pObj) );
    assert( Aig_ObjFanin0(pObj)->Id < Aig_ObjFanin1(pObj)->Id );
    for ( ppEntry = p->pTable + Aig_Hash(pObj, p->nTableSize); *ppEntry; ppEntry = &(*ppEntry)->pNext )
        if ( *ppEntry == pObj )
            return ppEntry;
    assert( *ppEntry == NULL );
    return ppEntry;
}